

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopPeeling::PeelBefore(LoopPeeling *this,uint32_t peel_factor)

{
  IRContext *pIVar1;
  Loop *this_00;
  bool bVar2;
  Analysis AVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t true_value;
  uint32_t false_value;
  Instruction *insert_before;
  BasicBlock *pBVar6;
  anon_class_24_3_680879f0 local_1c8;
  function<void_(spvtools::opt::Instruction_*)> local_1b0;
  BasicBlock *local_190;
  BasicBlock *if_block;
  BasicBlock *if_merge_block;
  LoopPeeling *local_178;
  function<unsigned_int_(spvtools::opt::Instruction_*)> local_170;
  BasicBlock *local_150;
  Instruction *max_iteration;
  Instruction *has_remaining_iteration;
  Instruction *factor;
  undefined1 local_130 [8];
  InstructionBuilder builder;
  LoopCloningResult clone_results;
  uint32_t peel_factor_local;
  LoopPeeling *this_local;
  
  bVar2 = CanPeelLoop(this);
  if (!bVar2) {
    __assert_fail("CanPeelLoop() && \"Cannot peel loop\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x19f,"void spvtools::opt::LoopPeeling::PeelBefore(uint32_t)");
  }
  LoopUtils::LoopCloningResult::LoopCloningResult((LoopCloningResult *)&builder.preserved_analyses_)
  ;
  DuplicateAndConnectLoop(this,(LoopCloningResult *)&builder.preserved_analyses_);
  InsertCanonicalInductionVariable(this,(LoopCloningResult *)&builder.preserved_analyses_);
  pIVar1 = this->context_;
  Loop::GetPreHeaderBlock(this->cloned_loop_);
  BasicBlock::tail((BasicBlock *)&factor);
  insert_before =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<spvtools::opt::Instruction>::operator*
                 ((iterator_template<spvtools::opt::Instruction> *)&factor);
  AVar3 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)local_130,pIVar1,insert_before,AVar3)
  ;
  bVar2 = analysis::Integer::IsSigned(this->int_type_);
  has_remaining_iteration =
       InstructionBuilder::GetIntConstant<unsigned_int>
                 ((InstructionBuilder *)local_130,peel_factor,bVar2);
  uVar4 = opt::Instruction::result_id(has_remaining_iteration);
  uVar5 = opt::Instruction::result_id(this->loop_iteration_count_);
  max_iteration = InstructionBuilder::AddLessThan((InstructionBuilder *)local_130,uVar4,uVar5);
  uVar4 = opt::Instruction::type_id(has_remaining_iteration);
  uVar5 = opt::Instruction::result_id(max_iteration);
  true_value = opt::Instruction::result_id(has_remaining_iteration);
  false_value = opt::Instruction::result_id(this->loop_iteration_count_);
  if_merge_block =
       (BasicBlock *)
       InstructionBuilder::AddSelect
                 ((InstructionBuilder *)local_130,uVar4,uVar5,true_value,false_value);
  local_178 = this;
  local_150 = if_merge_block;
  std::function<unsigned_int(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopPeeling::PeelBefore(unsigned_int)::__0,void>
            ((function<unsigned_int(spvtools::opt::Instruction*)> *)&local_170,
             (anon_class_16_2_c4f63cd3 *)&if_merge_block);
  FixExitCondition(this,&local_170);
  std::function<unsigned_int_(spvtools::opt::Instruction_*)>::~function(&local_170);
  if_block = Loop::GetMergeBlock(this->loop_);
  this_00 = this->loop_;
  pBVar6 = Loop::GetMergeBlock(this->loop_);
  pBVar6 = CreateBlockBefore(this,pBVar6);
  Loop::SetMergeBlock(this_00,pBVar6);
  local_1c8.if_block = ProtectLoop(this,this->loop_,max_iteration,if_block);
  pBVar6 = if_block;
  local_1c8.clone_results = (LoopCloningResult *)&builder.preserved_analyses_;
  local_1c8.this = this;
  local_190 = local_1c8.if_block;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopPeeling::PeelBefore(unsigned_int)::__1,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_1b0,&local_1c8);
  BasicBlock::ForEachPhiInst(pBVar6,&local_1b0,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_1b0);
  pIVar1 = this->context_;
  AVar3 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar3 = opt::operator|(AVar3,kAnalysisLoopAnalysis);
  AVar3 = opt::operator|(AVar3,kAnalysisCFG);
  IRContext::InvalidateAnalysesExceptFor(pIVar1,AVar3);
  LoopUtils::LoopCloningResult::~LoopCloningResult
            ((LoopCloningResult *)&builder.preserved_analyses_);
  return;
}

Assistant:

void LoopPeeling::PeelBefore(uint32_t peel_factor) {
  assert(CanPeelLoop() && "Cannot peel loop");
  LoopUtils::LoopCloningResult clone_results;

  // Clone the loop and insert the cloned one before the loop.
  DuplicateAndConnectLoop(&clone_results);

  // Add a canonical induction variable "canonical_induction_variable_".
  InsertCanonicalInductionVariable(&clone_results);

  InstructionBuilder builder(
      context_, &*cloned_loop_->GetPreHeaderBlock()->tail(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* factor =
      builder.GetIntConstant(peel_factor, int_type_->IsSigned());

  Instruction* has_remaining_iteration = builder.AddLessThan(
      factor->result_id(), loop_iteration_count_->result_id());
  Instruction* max_iteration = builder.AddSelect(
      factor->type_id(), has_remaining_iteration->result_id(),
      factor->result_id(), loop_iteration_count_->result_id());

  // Change the exit condition of the cloned loop to be (exit when become
  // false):
  //  "canonical_induction_variable_" < min("factor", "loop_iteration_count_")
  FixExitCondition([max_iteration, this](Instruction* insert_before_point) {
    return InstructionBuilder(context_, insert_before_point,
                              IRContext::kAnalysisDefUse |
                                  IRContext::kAnalysisInstrToBlockMapping)
        .AddLessThan(canonical_induction_variable_->result_id(),
                     max_iteration->result_id())
        ->result_id();
  });

  // "Protect" the second loop: the second loop can only be executed if
  // |has_remaining_iteration| is true (i.e. factor < loop_iteration_count_).
  BasicBlock* if_merge_block = loop_->GetMergeBlock();
  loop_->SetMergeBlock(CreateBlockBefore(loop_->GetMergeBlock()));
  // Prevent the second loop from being executed if we already executed all the
  // required iterations.
  BasicBlock* if_block =
      ProtectLoop(loop_, has_remaining_iteration, if_merge_block);
  // Patch the phi of the merge block.
  if_merge_block->ForEachPhiInst(
      [&clone_results, if_block, this](Instruction* phi) {
        // if_merge_block had previously only 1 predecessor.
        uint32_t incoming_value = phi->GetSingleWordInOperand(0);
        auto def_in_loop = clone_results.value_map_.find(incoming_value);
        if (def_in_loop != clone_results.value_map_.end())
          incoming_value = def_in_loop->second;
        phi->AddOperand(
            {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {incoming_value}});
        phi->AddOperand(
            {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {if_block->id()}});
        context_->get_def_use_mgr()->AnalyzeInstUse(phi);
      });

  context_->InvalidateAnalysesExceptFor(
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping |
      IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisCFG);
}